

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void LD4_C(uint8_t *dst)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  bVar1 = dst[-0x1e];
  uVar7 = (uint)dst[-0x1d];
  uVar6 = (uint)dst[-0x1c];
  uVar5 = (uint)dst[-0x1b];
  uVar3 = (uint)dst[-0x1a];
  bVar2 = dst[-0x19];
  *dst = (uint8_t)((uint)dst[-0x20] + (uint)bVar1 + 2 + (uint)dst[-0x1f] * 2 >> 2);
  uVar4 = (uint8_t)(uVar7 + dst[-0x1f] + 2 + (uint)bVar1 * 2 >> 2);
  dst[0x20] = uVar4;
  dst[1] = uVar4;
  uVar4 = (uint8_t)((uint)bVar1 + uVar7 * 2 + 2 + uVar6 >> 2);
  dst[0x40] = uVar4;
  dst[0x21] = uVar4;
  dst[2] = uVar4;
  uVar4 = (uint8_t)(uVar7 + uVar6 * 2 + 2 + uVar5 >> 2);
  dst[0x60] = uVar4;
  dst[0x41] = uVar4;
  dst[0x22] = uVar4;
  dst[3] = uVar4;
  uVar4 = (uint8_t)(uVar6 + uVar5 * 2 + uVar3 + 2 >> 2);
  dst[0x61] = uVar4;
  dst[0x42] = uVar4;
  dst[0x23] = uVar4;
  uVar4 = (uint8_t)(uVar5 + uVar3 * 2 + (uint)bVar2 + 2 >> 2);
  dst[0x62] = uVar4;
  dst[0x43] = uVar4;
  dst[99] = (uint8_t)(uVar3 + bVar2 + (uint)bVar2 * 2 + 2 >> 2);
  return;
}

Assistant:

static void LD4_C(uint8_t* dst) {   // Down-Left
  const int A = dst[0 - BPS];
  const int B = dst[1 - BPS];
  const int C = dst[2 - BPS];
  const int D = dst[3 - BPS];
  const int E = dst[4 - BPS];
  const int F = dst[5 - BPS];
  const int G = dst[6 - BPS];
  const int H = dst[7 - BPS];
  DST(0, 0)                                     = AVG3(A, B, C);
  DST(1, 0) = DST(0, 1)                         = AVG3(B, C, D);
  DST(2, 0) = DST(1, 1) = DST(0, 2)             = AVG3(C, D, E);
  DST(3, 0) = DST(2, 1) = DST(1, 2) = DST(0, 3) = AVG3(D, E, F);
              DST(3, 1) = DST(2, 2) = DST(1, 3) = AVG3(E, F, G);
                          DST(3, 2) = DST(2, 3) = AVG3(F, G, H);
                                      DST(3, 3) = AVG3(G, H, H);
}